

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O0

void __thiscall KokkosTools::SpaceTimeStack::StackNode::adopt(StackNode *this)

{
  bool bVar1;
  reference this_00;
  StackNode *child;
  iterator __end2;
  iterator __begin2;
  set<KokkosTools::SpaceTimeStack::StackNode,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
  *__range2;
  StackNode *this_local;
  
  if (this->kind != STACK_REGION) {
    this->total_kokkos_runtime = this->total_runtime + this->total_kokkos_runtime;
  }
  __end2 = std::
           set<KokkosTools::SpaceTimeStack::StackNode,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
           ::begin(&this->children);
  child = (StackNode *)
          std::
          set<KokkosTools::SpaceTimeStack::StackNode,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
          ::end(&this->children);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&child);
    if (!bVar1) break;
    this_00 = std::_Rb_tree_const_iterator<KokkosTools::SpaceTimeStack::StackNode>::operator*
                        (&__end2);
    adopt(this_00);
    this->total_kokkos_runtime = this_00->total_kokkos_runtime + this->total_kokkos_runtime;
    this->total_number_of_kernel_calls =
         this_00->total_number_of_kernel_calls + this->total_number_of_kernel_calls;
    std::_Rb_tree_const_iterator<KokkosTools::SpaceTimeStack::StackNode>::operator++(&__end2);
  }
  if (0.0 <= this->total_kokkos_runtime) {
    return;
  }
  __assert_fail("this->total_kokkos_runtime >= 0.",
                "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/space-time-stack/kp_space_time_stack.cpp"
                ,0xd8,"void KokkosTools::SpaceTimeStack::StackNode::adopt()");
}

Assistant:

void adopt() {
    if (this->kind != STACK_REGION) {
      this->total_kokkos_runtime += this->total_runtime;
    }
    for (auto& child : this->children) {
      const_cast<StackNode&>(child).adopt();
      this->total_kokkos_runtime += child.total_kokkos_runtime;
      this->total_number_of_kernel_calls += child.total_number_of_kernel_calls;
    }
    assert(this->total_kokkos_runtime >= 0.);
  }